

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  float fVar1;
  int *piVar2;
  void *pvVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  Layer *pLVar10;
  long lVar11;
  size_t sVar12;
  void *ptr;
  Option opt;
  ModelBinFromMatArray local_a08;
  undefined8 local_9f8;
  int local_9f0;
  Allocator *local_9e8;
  int local_9e0;
  int iStack_9dc;
  undefined8 uStack_9d8;
  size_t local_9d0;
  _func_int **local_9c0;
  Mat local_9b8;
  _func_int **local_978;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 local_968;
  undefined4 uStack_964;
  int local_960;
  Allocator *local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  size_t sStack_940;
  ParamDict local_930;
  
  if (norm_vals == (float *)0x0 && mean_vals != (float *)0x0) {
    pLVar10 = create_layer(3);
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,this->c);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_930);
    local_9b8.elemsize._0_4_ = 0;
    local_9b8.elemsize._4_4_ = 0;
    local_9b8.elempack = 0;
    local_9b8.data = (void *)0x0;
    local_9b8.refcount._0_4_ = 0;
    local_9b8.refcount._4_4_ = 0;
    local_9b8.allocator = (Allocator *)0x0;
    local_9b8.dims = 0;
    local_9b8.w = 0;
    local_9b8.h = 0;
    local_9b8.c = 0;
    local_9b8.cstep = 0;
    iStack_9dc = this->c;
    sVar12 = (size_t)iStack_9dc;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights = (Mat *)0x0;
    local_9f8 = 4;
    local_9f0 = 1;
    local_9e8 = (Allocator *)0x0;
    local_9e0 = 1;
    uStack_9d8._0_4_ = 1;
    uStack_9d8._4_4_ = 1;
    local_9d0 = sVar12;
    if (sVar12 != 0) {
      local_9c0 = (_func_int **)0x0;
      iVar9 = posix_memalign(&local_9c0,0x10,sVar12 * 4 + 4);
      local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
      if (iVar9 == 0) {
        local_a08.super_ModelBin._vptr_ModelBin = local_9c0;
      }
      local_a08.weights = (Mat *)(sVar12 * 4 + (long)local_a08.super_ModelBin._vptr_ModelBin);
      *(undefined4 *)&(local_a08.weights)->data = 1;
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_9b8.refcount._4_4_,local_9b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if (local_9b8.data != (void *)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    local_9b8.data = local_a08.super_ModelBin._vptr_ModelBin;
    local_9b8.refcount._0_4_ = SUB84(local_a08.weights,0);
    local_9b8.refcount._4_4_ = (undefined4)((ulong)local_a08.weights >> 0x20);
    local_9b8.elemsize._0_4_ = (undefined4)local_9f8;
    local_9b8.elemsize._4_4_ = (undefined4)((ulong)local_9f8 >> 0x20);
    local_9b8.elempack = local_9f0;
    local_9b8.allocator = local_9e8;
    local_9b8.w = iStack_9dc;
    local_9b8.dims = local_9e0;
    uVar7._0_4_ = (int)uStack_9d8;
    uVar7._4_4_ = uStack_9d8._4_4_;
    local_9b8.h = (int)uStack_9d8;
    local_9b8.c = uStack_9d8._4_4_;
    local_9b8.cstep = local_9d0;
    uVar8 = uVar7;
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + -1;
      UNLOCK();
      uVar8 = local_9b8._48_8_;
      if (*(int *)&(local_a08.weights)->data == 0) {
        if (local_9e8 == (Allocator *)0x0) {
          if (local_a08.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
            local_9b8._48_8_ = uVar7;
            free(local_a08.super_ModelBin._vptr_ModelBin);
            uVar8 = local_9b8._48_8_;
          }
        }
        else {
          local_9b8._48_8_ = uVar7;
          (**(code **)(*(long *)local_9e8 + 0x18))();
          uVar8 = local_9b8._48_8_;
        }
      }
    }
    local_9b8._48_8_ = uVar8;
    iVar9 = this->c;
    if (0 < (long)iVar9) {
      lVar11 = 0;
      do {
        *(float *)((long)local_9b8.data + lVar11 * 4) = -mean_vals[lVar11];
        lVar11 = lVar11 + 1;
      } while (iVar9 != lVar11);
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_a08,&local_9b8);
    (*pLVar10->_vptr_Layer[3])(pLVar10,&local_a08);
    ModelBin::~ModelBin(&local_a08.super_ModelBin);
    piVar2 = (int *)CONCAT44(local_9b8.refcount._4_4_,local_9b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if ((_func_int **)local_9b8.data != (_func_int **)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    lVar11 = 0x8c0;
    do {
      piVar2 = *(int **)((long)&local_930.params[0].v.data + lVar11);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = *(void **)((long)&local_930.params[0].type + lVar11);
          plVar4 = *(long **)((long)&local_930.params[0].v.elempack + lVar11);
          if (plVar4 == (long *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar11 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar11 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar11) = 0;
      lVar11 = lVar11 + -0x48;
    } while (lVar11 != -0x40);
  }
  else if (mean_vals == (float *)0x0 && norm_vals != (float *)0x0) {
    pLVar10 = create_layer(0x1d);
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,this->c);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_930);
    local_9b8.elemsize._0_4_ = 0;
    local_9b8.elemsize._4_4_ = 0;
    local_9b8.elempack = 0;
    local_9b8.data = (void *)0x0;
    local_9b8.refcount._0_4_ = 0;
    local_9b8.refcount._4_4_ = 0;
    local_9b8.allocator = (Allocator *)0x0;
    local_9b8.dims = 0;
    local_9b8.w = 0;
    local_9b8.h = 0;
    local_9b8.c = 0;
    local_9b8.cstep = 0;
    iStack_9dc = this->c;
    sVar12 = (size_t)iStack_9dc;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights = (Mat *)0x0;
    local_9f8 = 4;
    local_9f0 = 1;
    local_9e8 = (Allocator *)0x0;
    local_9e0 = 1;
    uStack_9d8._0_4_ = 1;
    uStack_9d8._4_4_ = 1;
    local_9d0 = sVar12;
    if (sVar12 != 0) {
      local_9c0 = (_func_int **)0x0;
      iVar9 = posix_memalign(&local_9c0,0x10,sVar12 * 4 + 4);
      local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
      if (iVar9 == 0) {
        local_a08.super_ModelBin._vptr_ModelBin = local_9c0;
      }
      local_a08.weights = (Mat *)(sVar12 * 4 + (long)local_a08.super_ModelBin._vptr_ModelBin);
      *(undefined4 *)&(local_a08.weights)->data = 1;
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_9b8.refcount._4_4_,local_9b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if (local_9b8.data != (void *)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    local_9b8.data = local_a08.super_ModelBin._vptr_ModelBin;
    local_9b8.refcount._0_4_ = SUB84(local_a08.weights,0);
    local_9b8.refcount._4_4_ = (undefined4)((ulong)local_a08.weights >> 0x20);
    local_9b8.elemsize._0_4_ = (undefined4)local_9f8;
    local_9b8.elemsize._4_4_ = (undefined4)((ulong)local_9f8 >> 0x20);
    local_9b8.elempack = local_9f0;
    local_9b8.allocator = local_9e8;
    local_9b8.w = iStack_9dc;
    local_9b8.dims = local_9e0;
    uVar5._0_4_ = (int)uStack_9d8;
    uVar5._4_4_ = uStack_9d8._4_4_;
    local_9b8.h = (int)uStack_9d8;
    local_9b8.c = uStack_9d8._4_4_;
    local_9b8.cstep = local_9d0;
    uVar7 = uVar5;
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + -1;
      UNLOCK();
      uVar7 = local_9b8._48_8_;
      if (*(int *)&(local_a08.weights)->data == 0) {
        if (local_9e8 == (Allocator *)0x0) {
          if (local_a08.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
            local_9b8._48_8_ = uVar5;
            free(local_a08.super_ModelBin._vptr_ModelBin);
            uVar7 = local_9b8._48_8_;
          }
        }
        else {
          local_9b8._48_8_ = uVar5;
          (**(code **)(*(long *)local_9e8 + 0x18))();
          uVar7 = local_9b8._48_8_;
        }
      }
    }
    local_9b8._48_8_ = uVar7;
    iVar9 = this->c;
    if (0 < (long)iVar9) {
      lVar11 = 0;
      do {
        *(float *)((long)local_9b8.data + lVar11 * 4) = norm_vals[lVar11];
        lVar11 = lVar11 + 1;
      } while (iVar9 != lVar11);
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_a08,&local_9b8);
    (*pLVar10->_vptr_Layer[3])(pLVar10,&local_a08);
    ModelBin::~ModelBin(&local_a08.super_ModelBin);
    piVar2 = (int *)CONCAT44(local_9b8.refcount._4_4_,local_9b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if ((_func_int **)local_9b8.data != (_func_int **)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    lVar11 = 0x8c0;
    do {
      piVar2 = *(int **)((long)&local_930.params[0].v.data + lVar11);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = *(void **)((long)&local_930.params[0].type + lVar11);
          plVar4 = *(long **)((long)&local_930.params[0].v.elempack + lVar11);
          if (plVar4 == (long *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar11 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar11 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar11) = 0;
      lVar11 = lVar11 + -0x48;
    } while (lVar11 != -0x40);
  }
  else {
    if (mean_vals == (float *)0x0 || norm_vals == (float *)0x0) {
      return;
    }
    pLVar10 = create_layer(0x1d);
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,this->c);
    ParamDict::set(&local_930,1,1);
    (*pLVar10->_vptr_Layer[2])(pLVar10);
    local_9b8.elemsize._0_4_ = 0;
    local_9b8.elemsize._4_4_ = 0;
    local_9b8.elempack = 0;
    local_9b8.data = (void *)0x0;
    local_9b8.refcount._0_4_ = 0;
    local_9b8.refcount._4_4_ = 0;
    local_958 = (Allocator *)0x0;
    uStack_950 = 0;
    local_948 = 0;
    sStack_940 = 0;
    local_9b8.allocator = (Allocator *)0x0;
    local_9b8.dims = 0;
    local_9b8.w = 0;
    local_9b8.h = 0;
    local_9b8.c = 0;
    local_9b8.cstep = 0;
    local_978 = (_func_int **)0x0;
    uStack_970 = 0;
    uStack_96c = 0;
    local_968 = 0;
    uStack_964 = 0;
    local_960 = 0;
    iStack_9dc = this->c;
    sVar12 = (size_t)iStack_9dc;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights = (Mat *)0x0;
    local_9f8 = 4;
    local_9f0 = 1;
    local_9e8 = (Allocator *)0x0;
    local_9e0 = 1;
    uStack_9d8._0_4_ = 1;
    uStack_9d8._4_4_ = 1;
    local_9d0 = sVar12;
    if (sVar12 != 0) {
      local_9c0 = (_func_int **)0x0;
      iVar9 = posix_memalign(&local_9c0,0x10,sVar12 * 4 + 4);
      local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
      if (iVar9 == 0) {
        local_a08.super_ModelBin._vptr_ModelBin = local_9c0;
      }
      local_a08.weights = (Mat *)(sVar12 * 4 + (long)local_a08.super_ModelBin._vptr_ModelBin);
      *(undefined4 *)&(local_a08.weights)->data = 1;
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_9b8.refcount._4_4_,local_9b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_9b8.allocator == (Allocator *)0x0) {
          if (local_9b8.data != (void *)0x0) {
            free(local_9b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_9b8.allocator + 0x18))();
        }
      }
    }
    local_9b8.data = local_a08.super_ModelBin._vptr_ModelBin;
    local_9b8.refcount._0_4_ = SUB84(local_a08.weights,0);
    local_9b8.refcount._4_4_ = (undefined4)((ulong)local_a08.weights >> 0x20);
    local_9b8.elemsize._0_4_ = (undefined4)local_9f8;
    local_9b8.elemsize._4_4_ = (undefined4)((ulong)local_9f8 >> 0x20);
    local_9b8.elempack = local_9f0;
    local_9b8.allocator = local_9e8;
    local_9b8.w = iStack_9dc;
    local_9b8.dims = local_9e0;
    uVar8._0_4_ = (int)uStack_9d8;
    uVar8._4_4_ = uStack_9d8._4_4_;
    local_9b8.h = (int)uStack_9d8;
    local_9b8.c = uStack_9d8._4_4_;
    local_9b8.cstep = local_9d0;
    uVar7 = uVar8;
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + -1;
      UNLOCK();
      uVar7 = local_9b8._48_8_;
      if (*(int *)&(local_a08.weights)->data == 0) {
        if (local_9e8 == (Allocator *)0x0) {
          if (local_a08.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
            local_9b8._48_8_ = uVar8;
            free(local_a08.super_ModelBin._vptr_ModelBin);
            uVar7 = local_9b8._48_8_;
          }
        }
        else {
          local_9b8._48_8_ = uVar8;
          (**(code **)(*(long *)local_9e8 + 0x18))();
          uVar7 = local_9b8._48_8_;
        }
      }
    }
    local_9b8._48_8_ = uVar7;
    iStack_9dc = this->c;
    sVar12 = (size_t)iStack_9dc;
    local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
    local_a08.weights = (Mat *)0x0;
    local_9f8 = 4;
    local_9f0 = 1;
    local_9e8 = (Allocator *)0x0;
    local_9e0 = 1;
    uStack_9d8._0_4_ = 1;
    uStack_9d8._4_4_ = 1;
    local_9d0 = sVar12;
    if (sVar12 != 0) {
      local_9c0 = (_func_int **)0x0;
      iVar9 = posix_memalign(&local_9c0,0x10,sVar12 * 4 + 4);
      local_a08.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
      if (iVar9 == 0) {
        local_a08.super_ModelBin._vptr_ModelBin = local_9c0;
      }
      local_a08.weights = (Mat *)(sVar12 * 4 + (long)local_a08.super_ModelBin._vptr_ModelBin);
      *(undefined4 *)&(local_a08.weights)->data = 1;
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_96c,uStack_970);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_958 == (Allocator *)0x0) {
          if (local_978 != (_func_int **)0x0) {
            free(local_978);
          }
        }
        else {
          (**(code **)(*(long *)local_958 + 0x18))();
        }
      }
    }
    local_978 = local_a08.super_ModelBin._vptr_ModelBin;
    uStack_970 = SUB84(local_a08.weights,0);
    uStack_96c = (undefined4)((ulong)local_a08.weights >> 0x20);
    local_968 = (undefined4)local_9f8;
    uStack_964 = (undefined4)((ulong)local_9f8 >> 0x20);
    local_960 = local_9f0;
    local_958 = local_9e8;
    uStack_950 = CONCAT44(iStack_9dc,local_9e0);
    uVar6._0_4_ = (int)uStack_9d8;
    uVar6._4_4_ = uStack_9d8._4_4_;
    local_948._0_4_ = (int)uStack_9d8;
    local_948._4_4_ = uStack_9d8._4_4_;
    sStack_940 = local_9d0;
    uVar7 = uVar6;
    if (local_a08.weights != (Mat *)0x0) {
      LOCK();
      *(int *)&(local_a08.weights)->data = *(int *)&(local_a08.weights)->data + -1;
      UNLOCK();
      uVar7 = local_948;
      if (*(int *)&(local_a08.weights)->data == 0) {
        if (local_9e8 == (Allocator *)0x0) {
          if (local_a08.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
            local_948 = uVar6;
            free(local_a08.super_ModelBin._vptr_ModelBin);
            uVar7 = local_948;
          }
        }
        else {
          local_948 = uVar6;
          (**(code **)(*(long *)local_9e8 + 0x18))();
          uVar7 = local_948;
        }
      }
    }
    local_948 = uVar7;
    iVar9 = this->c;
    if (0 < (long)iVar9) {
      lVar11 = 0;
      do {
        fVar1 = norm_vals[lVar11];
        *(float *)((long)local_9b8.data + lVar11 * 4) = fVar1;
        *(float *)((long)local_978 + lVar11 * 4) = -mean_vals[lVar11] * fVar1;
        lVar11 = lVar11 + 1;
      } while (iVar9 != lVar11);
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_a08,&local_9b8);
    (*pLVar10->_vptr_Layer[3])(pLVar10,&local_a08);
    ModelBin::~ModelBin(&local_a08.super_ModelBin);
    lVar11 = 0x40;
    do {
      piVar2 = *(int **)((long)&local_9b8.refcount + lVar11);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = *(void **)((long)&local_9b8.data + lVar11);
          plVar4 = *(long **)((long)&local_9b8.allocator + lVar11);
          if (plVar4 == (long *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_9b8.refcount + lVar11 + 4) = 0;
      *(undefined8 *)((long)&local_9b8.elemsize + lVar11 + 4) = 0;
      *(undefined8 *)((long)&local_9b8.data + lVar11) = 0;
      *(undefined8 *)((long)&local_9b8.refcount + lVar11) = 0;
      *(undefined8 *)((long)&local_9b8.dims + lVar11) = 0;
      *(undefined8 *)((long)&local_9b8.h + lVar11) = 0;
      *(undefined8 *)((long)&local_9b8.cstep + lVar11) = 0;
      lVar11 = lVar11 + -0x40;
    } while (lVar11 != -0x40);
    lVar11 = 0x8c0;
    do {
      piVar2 = *(int **)((long)&local_930.params[0].v.data + lVar11);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = *(void **)((long)&local_930.params[0].type + lVar11);
          plVar4 = *(long **)((long)&local_930.params[0].v.elempack + lVar11);
          if (plVar4 == (long *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar11 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar11 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar11) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar11) = 0;
      lVar11 = lVar11 + -0x48;
    } while (lVar11 != -0x40);
  }
  Option::Option((Option *)&local_930);
  local_930.params[0].field_1.i = 1;
  (*pLVar10->_vptr_Layer[4])(pLVar10,(Option *)&local_930);
  (*pLVar10->_vptr_Layer[9])(pLVar10,this,(Option *)&local_930);
  (*pLVar10->_vptr_Layer[5])(pLVar10,(Option *)&local_930);
  (*pLVar10->_vptr_Layer[1])(pLVar10);
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = - mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1;// TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}